

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward
          (Convolution *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int _kernel_w;
  int _kernel_h;
  Mat *bottom_blob;
  Mat *this_00;
  int *piVar1;
  int iVar2;
  undefined4 in_stack_fffffffffffffed8;
  int _c;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _kernel_w = bottom_blob[1].w;
  _kernel_h = bottom_blob[1].h;
  _c = bottom_blob[1].c;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  flatten(bottom_blob + 1,&local_78,opt);
  iVar2 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_00154dd2;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118._20_8_ = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  if (this->bias_term == 0) {
LAB_00154c35:
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    make_padding(this,bottom_blob,&local_c8,_kernel_w,_kernel_h,opt);
    iVar2 = -100;
    if ((local_c8.data != (void *)0x0) &&
       ((((long)local_c8.c * local_c8.cstep != 0 &&
         (Mat::create(this_00,(~((_kernel_w + -1) * this->dilation_w) + local_c8.w) / this->stride_w
                              + 1,
                      (~((_kernel_h + -1) * this->dilation_h) + local_c8.h) / this->stride_h + 1,_c,
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize),
                      opt->blob_allocator), this_00->data != (void *)0x0)) &&
        ((long)this_00->c * this_00->cstep != 0)))) {
      convolution(&local_c8,this_00,&local_78,&local_118,_kernel_w,_kernel_h,this->stride_w,
                  this->stride_h,this->dilation_w,this->dilation_h,this->activation_type,
                  &this->activation_params,(Option *)CONCAT44(_c,in_stack_fffffffffffffed8));
      iVar2 = 0;
    }
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + 2,&local_118,opt);
    iVar2 = -100;
    if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
    goto LAB_00154c35;
  }
  piVar1 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00154dd2:
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int Convolution::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, _kernel_h, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}